

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O0

void F3DAudioCalculate(uint8_t *Instance,F3DAUDIO_LISTENER *pListener,F3DAUDIO_EMITTER *pEmitter,
                      uint32_t Flags,F3DAUDIO_DSP_SETTINGS *pDSPSettings)

{
  code *pcVar1;
  int iVar2;
  uint in_ECX;
  F3DAUDIO_EMITTER *in_RDX;
  F3DAUDIO_LISTENER *in_RSI;
  int *in_RDI;
  long in_R8;
  float eToLDistance_00;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  F3DAUDIO_VECTOR emitterToListener_00;
  F3DAUDIO_DSP_SETTINGS *in_stack_00000020;
  uint32_t in_stack_0000002c;
  F3DAUDIO_EMITTER *in_stack_00000030;
  SDL_AssertState sdl_assert_state;
  F3DAUDIO_LISTENER *in_stack_00000038;
  uint8_t *in_stack_00000040;
  float dp;
  float normalizedDistance;
  float eToLDistance;
  F3DAUDIO_VECTOR emitterToListener;
  uint32_t i;
  float in_stack_000001f0;
  float in_stack_000001f4;
  uint32_t in_stack_000001f8;
  uint32_t in_stack_000001fc;
  F3DAUDIO_EMITTER *in_stack_00000200;
  F3DAUDIO_LISTENER *in_stack_00000208;
  uint32_t in_stack_00000214;
  uint32_t in_stack_00000218;
  F3DAUDIO_VECTOR in_stack_0000022c;
  float *in_stack_00000240;
  F3DAUDIO_DISTANCE_CURVE *local_b0;
  F3DAUDIO_DISTANCE_CURVE *local_a0;
  F3DAUDIO_DISTANCE_CURVE *local_90;
  float local_58;
  float local_38;
  float fStack_34;
  uint local_2c;
  
  emitterToListener_00 =
       Vec((in_RSI->Position).x - (in_RDX->Position).x,(in_RSI->Position).y - (in_RDX->Position).y,
           (in_RSI->Position).z - (in_RDX->Position).z);
  local_58 = emitterToListener_00.z;
  local_38 = emitterToListener_00.x;
  fStack_34 = emitterToListener_00.y;
  eToLDistance_00 =
       (float)SDL_sqrtf(local_58 * local_58 + local_38 * local_38 + fStack_34 * fStack_34);
  *(float *)(in_R8 + 0x2c) = eToLDistance_00;
  F3DAudioCheckCalculateParams
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002c,
             in_stack_00000020);
  fVar3 = eToLDistance_00 / in_RDX->CurveDistanceScaler;
  if ((in_ECX & 1) != 0) {
    CalculateMatrix(in_stack_00000218,in_stack_00000214,in_stack_00000208,in_stack_00000200,
                    in_stack_000001fc,in_stack_000001f8,in_stack_0000022c,in_stack_000001f4,
                    in_stack_000001f0,in_stack_00000240);
  }
  if ((in_ECX & 4) != 0) {
    if (in_RDX->pLPFDirectCurve == (F3DAUDIO_DISTANCE_CURVE *)0x0) {
      local_90 = &F3DAudioCalculate::lpfDirectDefault;
    }
    else {
      local_90 = in_RDX->pLPFDirectCurve;
    }
    fVar4 = ComputeDistanceAttenuation(fVar3,local_90);
    *(float *)(in_R8 + 0x18) = fVar4;
  }
  if ((in_ECX & 8) != 0) {
    if (in_RDX->pLPFReverbCurve == (F3DAUDIO_DISTANCE_CURVE *)0x0) {
      local_a0 = &F3DAudioCalculate::lpfReverbDefault;
    }
    else {
      local_a0 = in_RDX->pLPFReverbCurve;
    }
    fVar4 = ComputeDistanceAttenuation(fVar3,local_a0);
    *(float *)(in_R8 + 0x1c) = fVar4;
  }
  if ((in_ECX & 0x10) != 0) {
    if (in_RDX->pReverbCurve == (F3DAUDIO_DISTANCE_CURVE *)0x0) {
      local_b0 = &F3DAudioCalculate::reverbDefault;
    }
    else {
      local_b0 = in_RDX->pReverbCurve;
    }
    fVar3 = ComputeDistanceAttenuation(fVar3,local_b0);
    *(float *)(in_R8 + 0x20) = fVar3;
  }
  if ((in_ECX & 0x20) != 0) {
    CalculateDoppler((float)in_RDI[3],in_RSI,in_RDX,emitterToListener_00,eToLDistance_00,
                     (float *)(in_R8 + 0x34),(float *)(in_R8 + 0x30),(float *)(in_R8 + 0x24));
  }
  if ((in_ECX & 0x40) != 0) {
    if (1.2e-07 <= eToLDistance_00) {
      uVar5 = SDL_acosf((local_58 * (in_RDX->OrientFront).z +
                        local_38 * (in_RDX->OrientFront).x + fStack_34 * (in_RDX->OrientFront).y) /
                        eToLDistance_00);
      *(undefined4 *)(in_R8 + 0x28) = uVar5;
    }
    else {
      *(undefined4 *)(in_R8 + 0x28) = 0x3fc90fdb;
    }
  }
  if (((in_ECX & 2) != 0) && (*in_RDI == 3)) {
    for (local_2c = 0; local_2c < *(uint *)(in_R8 + 0x14); local_2c = local_2c + 1) {
      *(undefined4 *)(*(long *)(in_R8 + 8) + (ulong)local_2c * 4) = 0;
    }
    do {
      iVar2 = SDL_ReportAssertion(&F3DAudioCalculate::sdl_assert_data,"F3DAudioCalculate",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x617);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
  }
  return;
}

Assistant:

void F3DAudioCalculate(
	const F3DAUDIO_HANDLE Instance,
	const F3DAUDIO_LISTENER *pListener,
	const F3DAUDIO_EMITTER *pEmitter,
	uint32_t Flags,
	F3DAUDIO_DSP_SETTINGS *pDSPSettings
) {
	uint32_t i;
	F3DAUDIO_VECTOR emitterToListener;
	float eToLDistance, normalizedDistance, dp;

	#define DEFAULT_POINTS(name, x1, y1, x2, y2) \
		static F3DAUDIO_DISTANCE_CURVE_POINT name##Points[2] = \
		{ \
			{ x1, y1 }, \
			{ x2, y2 } \
		}; \
		static F3DAUDIO_DISTANCE_CURVE name##Default = \
		{ \
			(F3DAUDIO_DISTANCE_CURVE_POINT*) &name##Points[0], 2 \
		};
	DEFAULT_POINTS(lpfDirect, 0.0f, 1.0f, 1.0f, 0.75f)
	DEFAULT_POINTS(lpfReverb, 0.0f, 0.75f, 1.0f, 0.75f)
	DEFAULT_POINTS(reverb, 0.0f, 1.0f, 1.0f, 0.0f)
	#undef DEFAULT_POINTS

	/* For XACT, this calculates "Distance" */
	emitterToListener = VectorSub(pListener->Position, pEmitter->Position);
	eToLDistance = VectorLength(emitterToListener);
	pDSPSettings->EmitterToListenerDistance = eToLDistance;

	F3DAudioCheckCalculateParams(Instance, pListener, pEmitter, Flags, pDSPSettings);

	/* This is used by MATRIX, LPF, and REVERB */
	normalizedDistance = eToLDistance / pEmitter->CurveDistanceScaler;

	if (Flags & F3DAUDIO_CALCULATE_MATRIX)
	{
		CalculateMatrix(
			SPEAKERMASK(Instance),
			Flags,
			pListener,
			pEmitter,
			pDSPSettings->SrcChannelCount,
			pDSPSettings->DstChannelCount,
			emitterToListener,
			eToLDistance,
			normalizedDistance,
			pDSPSettings->pMatrixCoefficients
		);
	}

	if (Flags & F3DAUDIO_CALCULATE_LPF_DIRECT)
	{
		pDSPSettings->LPFDirectCoefficient = ComputeDistanceAttenuation(
			normalizedDistance,
			(pEmitter->pLPFDirectCurve != NULL) ?
				pEmitter->pLPFDirectCurve :
				&lpfDirectDefault
		);
	}

	if (Flags & F3DAUDIO_CALCULATE_LPF_REVERB)
	{
		pDSPSettings->LPFReverbCoefficient = ComputeDistanceAttenuation(
			normalizedDistance,
			(pEmitter->pLPFReverbCurve != NULL) ?
				pEmitter->pLPFReverbCurve :
				&lpfReverbDefault
		);
	}

	if (Flags & F3DAUDIO_CALCULATE_REVERB)
	{
		pDSPSettings->ReverbLevel = ComputeDistanceAttenuation(
			normalizedDistance,
			(pEmitter->pReverbCurve != NULL) ?
				pEmitter->pReverbCurve :
				&reverbDefault
		);
	}

	/* For XACT, this calculates "DopplerPitchScalar" */
	if (Flags & F3DAUDIO_CALCULATE_DOPPLER)
	{
		CalculateDoppler(
			SPEEDOFSOUND(Instance),
			pListener,
			pEmitter,
			emitterToListener,
			eToLDistance,
			&pDSPSettings->ListenerVelocityComponent,
			&pDSPSettings->EmitterVelocityComponent,
			&pDSPSettings->DopplerFactor
		);
	}

	/* For XACT, this calculates "OrientationAngle" */
	if (Flags & F3DAUDIO_CALCULATE_EMITTER_ANGLE)
	{
		/* Determined roughly.
		 * Below that distance, the emitter angle is considered to be PI/2.
		 */
		#define EMITTER_ANGLE_NULL_DISTANCE 1.2e-7
		if (eToLDistance < EMITTER_ANGLE_NULL_DISTANCE)
		{
			pDSPSettings->EmitterToListenerAngle = F3DAUDIO_PI / 2.0f;
		}
		else
		{
			/* Note: pEmitter->OrientFront is normalized. */
			dp = VectorDot(emitterToListener, pEmitter->OrientFront) / eToLDistance;
			pDSPSettings->EmitterToListenerAngle = FAudio_acosf(dp);
		}
	}

	/* Unimplemented Flags */
	if (	(Flags & F3DAUDIO_CALCULATE_DELAY) &&
		SPEAKERMASK(Instance) == SPEAKER_STEREO	)
	{
		for (i = 0; i < pDSPSettings->DstChannelCount; i += 1)
		{
			pDSPSettings->pDelayTimes[i] = 0.0f;
		}
		FAudio_assert(0 && "DELAY not implemented!");
	}
}